

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

bool DepParserTask::is_valid(uint64_t action,v_array<unsigned_int> valid_actions)

{
  size_t sVar1;
  uint *puVar2;
  ulong in_RDI;
  size_t i;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar1 = v_array<unsigned_int>::size((v_array<unsigned_int> *)&stack0x00000008);
    if (sVar1 <= local_18) {
      return false;
    }
    puVar2 = v_array<unsigned_int>::operator[]((v_array<unsigned_int> *)&stack0x00000008,local_18);
    if (*puVar2 == in_RDI) break;
    local_18 = local_18 + 1;
  }
  return true;
}

Assistant:

bool is_valid(uint64_t action, v_array<uint32_t> valid_actions)
{
  for (size_t i = 0; i < valid_actions.size(); i++)
    if (valid_actions[i] == action)
      return true;
  return false;
}